

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setupTest.cpp
# Opt level: O0

void __thiscall MPI_Init_Test::TestBody(MPI_Init_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_48;
  Message local_40 [3];
  int local_28;
  int local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  MPI_Init_Test *this_local;
  
  gtest_ar.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
  ;
  local_24 = MPI_Init(0);
  local_28 = 0;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)local_20,"MPI_Init(nullptr, nullptr)","0",&local_24,&local_28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/MGessinger[P]NVsolver/tests/setupTest.cpp"
               ,0x32,message);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  return;
}

Assistant:

TEST(MPI, Init)
{
	EXPECT_EQ(MPI_Init(nullptr, nullptr),MPI_SUCCESS);
}